

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonmodelserialiser.cpp
# Opt level: O0

bool __thiscall JsonModelSerialiser::saveModel(JsonModelSerialiser *this,QIODevice *destination)

{
  byte bVar1;
  QTextStream local_58 [8];
  QTextStream writer;
  undefined1 local_38 [8];
  QString tempString;
  QIODevice *destination_local;
  JsonModelSerialiser *this_local;
  
  if (destination == (QIODevice *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    tempString.d.size = (qsizetype)destination;
    QString::QString((QString *)local_38);
    bVar1 = (**(code **)(*(long *)&(this->super_AbstractStringSerialiser).
                                   super_AbstractModelSerialiser + 0xc0))(this,(QString *)local_38);
    this_local._7_1_ = (bVar1 & 1) != 0;
    if (this_local._7_1_) {
      QTextStream::QTextStream(local_58,(QIODevice *)tempString.d.size);
      QTextStream::operator<<(local_58,(QString *)local_38);
      QTextStream::~QTextStream(local_58);
    }
    QString::~QString((QString *)local_38);
  }
  return this_local._7_1_;
}

Assistant:

bool JsonModelSerialiser::saveModel(QIODevice *destination) const
{
    if (!destination)
        return false;
    QString tempString;
    if (!saveModel(&tempString))
        return false;
    QTextStream writer(destination);
#if (QT_VERSION < QT_VERSION_CHECK(6, 0, 0))
    writer.setCodec(textCodec());
#endif
    writer << tempString;
    return true;
}